

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O1

double __thiscall IF97::BaseRegion::d2gammar_dPIdTAU(BaseRegion *this,double T,double p)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  (*this->_vptr_BaseRegion[3])(p);
  (*this->_vptr_BaseRegion[4])(T);
  piVar3 = (this->Jr).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  lVar6 = (long)(this->Jr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar3;
  if (lVar6 == 0) {
    dVar9 = 0.0;
  }
  else {
    lVar6 = lVar6 >> 2;
    dVar9 = 0.0;
    lVar7 = 0;
    do {
      iVar1 = (this->Ir).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar7];
      dVar10 = 1.0;
      uVar8 = iVar1 - 1;
      if (uVar8 != 0) {
        uVar5 = -uVar8;
        if (0 < (int)uVar8) {
          uVar5 = uVar8;
        }
        dVar11 = 1.0 / extraout_XMM0_Qa;
        if (0 < iVar1) {
          dVar11 = extraout_XMM0_Qa;
        }
        dVar10 = 1.0;
        do {
          if ((uVar5 & 1) != 0) {
            dVar10 = dVar10 * dVar11;
          }
          dVar11 = dVar11 * dVar11;
          bVar4 = 1 < uVar5;
          uVar5 = uVar5 >> 1;
        } while (bVar4);
      }
      iVar2 = piVar3[lVar7];
      dVar11 = 1.0;
      uVar8 = iVar2 - 1;
      if (uVar8 != 0) {
        uVar5 = -uVar8;
        if (0 < (int)uVar8) {
          uVar5 = uVar8;
        }
        dVar12 = 1.0 / extraout_XMM0_Qa_00;
        if (0 < iVar2) {
          dVar12 = extraout_XMM0_Qa_00;
        }
        dVar11 = 1.0;
        do {
          if ((uVar5 & 1) != 0) {
            dVar11 = dVar11 * dVar12;
          }
          dVar12 = dVar12 * dVar12;
          bVar4 = 1 < uVar5;
          uVar5 = uVar5 >> 1;
        } while (bVar4);
      }
      dVar9 = dVar9 + (double)iVar1 *
                      (double)iVar2 *
                      (this->nr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar7] * dVar10 * dVar11;
      lVar7 = lVar7 + 1;
    } while (lVar7 != lVar6 + (ulong)(lVar6 == 0));
  }
  return dVar9;
}

Assistant:

double d2gammar_dPIdTAU(double T, double p) const{
            const double _PI = PIrterm(p), _TAU = TAUrterm(T);
            double summer = 0;
            for (std::size_t i = 0; i < Jr.size(); ++i){
                summer += nr[i]*Jr[i]*Ir[i]*powi(_PI, Ir[i]-1)*powi(_TAU, Jr[i]-1);
            }
            return summer;
        }